

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_set_length(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  vm_val_t nil_val;
  vm_val_t local_38;
  
  if (getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_length();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_length::desc);
  if (iVar2 == 0) {
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    uVar3 = CVmBif::pop_long_val();
    if (0xfffe < uVar3) {
      err_throw(0x902);
    }
    set_element_count_undo(this,self,(ulong)uVar3);
    local_38.typ = VM_NIL;
    if ((int)(uint)uVar1 < (int)uVar3) {
      lVar4 = (ulong)uVar1 * 5 + 4;
      lVar5 = (ulong)uVar3 - (ulong)uVar1;
      do {
        vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + lVar4,&local_38);
        lVar4 = lVar4 + 5;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_set_length(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    size_t old_len;
    int32_t new_len;
    int32_t idx;
    vm_val_t nil_val;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* note the old length */
    old_len = get_element_count();

    /* get the new length */
    new_len = CVmBif::pop_long_val(vmg0_);

    /* can't go less than zero */
    if (new_len < 0 || new_len >= VEC_MAX_ELEMENTS)
        err_throw(VMERR_BAD_VAL_BIF);

    /* set the vector to its new size */
    set_element_count_undo(vmg_ self, (size_t)new_len);

    /* 
     *   Set each newly added element to nil.  Note that we don't bother
     *   saving undo for these changes: to undo this change, the only thing
     *   we'll have to do is reduce the vector size to its previous size,
     *   and we've already saved undo for the size change.  
     */
    nil_val.set_nil();
    for (idx = old_len ; idx < new_len ; ++idx)
        set_element((size_t)idx, &nil_val);

    /* handled */
    return TRUE;
}